

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  bool bVar1;
  ostream *poVar2;
  TestCaseTracker *this_00;
  IStreamingReporter *pIVar3;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream oss;
  Counts *assertions_local;
  SectionInfo *sectionInfo_local;
  RunContext *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,(string *)sectionInfo);
  poVar2 = std::operator<<(poVar2,"@");
  Catch::operator<<(poVar2,&sectionInfo->lineInfo);
  this_00 = Option<Catch::SectionTracking::TestCaseTracker>::operator->(&this->m_testCaseTracker);
  std::__cxx11::ostringstream::str();
  bVar1 = SectionTracking::TestCaseTracker::enterSection(this_00,local_1d0);
  std::__cxx11::string::~string((string *)local_1d0);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    SourceLineInfo::operator=(&(this->m_lastAssertionInfo).lineInfo,&sectionInfo->lineInfo);
    pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
    (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar3,sectionInfo);
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = (this->m_totals).assertions.failed;
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return bVar1;
}

Assistant:

virtual bool sectionStarted (
            SectionInfo const& sectionInfo,
            Counts& assertions
        )
        {
            std::ostringstream oss;
            oss << sectionInfo.name << "@" << sectionInfo.lineInfo;

            if( !m_testCaseTracker->enterSection( oss.str() ) )
                return false;

            m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

            m_reporter->sectionStarting( sectionInfo );

            assertions = m_totals.assertions;

            return true;
        }